

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBase.cpp
# Opt level: O3

void __thiscall
vkt::sparse::SparseResourcesBaseInstance::createDeviceSupportingQueues
          (SparseResourcesBaseInstance *this,QueueRequirementsVec *queueRequirements)

{
  _Rb_tree_node_base *__k;
  Move<vk::VkDevice_s_*> *pMVar1;
  MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *this_00;
  iterator __position;
  iterator __position_00;
  VkDevice pVVar2;
  SimpleAllocator *pSVar3;
  VkDevice_s *pVVar4;
  DestroyDeviceFunc p_Var5;
  VkAllocationCallbacks *pVVar6;
  InstanceInterface *pIVar7;
  VkPhysicalDevice pVVar8;
  pointer pQVar9;
  mapped_type *pmVar10;
  vector<vkt::sparse::Queue,std::allocator<vkt::sparse::Queue>> *this_01;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  DeviceDriver *pDVar13;
  SimpleAllocator *this_02;
  VkQueue pVVar14;
  SparseResourcesBaseInstance *pSVar15;
  NotSupportedError *this_03;
  ResourceError *pRVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  SparseResourcesBaseInstance *pSVar21;
  ulong uVar22;
  uint uVar23;
  deUint32 dVar24;
  deUint32 dVar25;
  deUint32 queueFamilyPropertiesCount;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  SelectedQueuesMap selectedQueueFamilies;
  QueuePrioritiesMap queuePriorities;
  Queue queue;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkDeviceCreateInfo deviceInfo;
  uint local_45c;
  VkDeviceQueueCreateInfo *local_458;
  iterator iStack_450;
  VkDeviceQueueCreateInfo *local_448;
  SparseResourcesBaseInstance *local_438;
  uint local_42c;
  Move<vk::VkDevice_s_*> local_428;
  VkPhysicalDevice local_410;
  InstanceInterface *local_408;
  QueueRequirementsVec *local_400;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_3f8;
  ulong local_3d8;
  map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
  *local_3d0;
  map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
  local_3c8;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  local_398;
  VkPhysicalDeviceMemoryProperties local_368;
  VkPhysicalDeviceFeatures local_154;
  VkDeviceCreateInfo local_78;
  
  local_400 = queueRequirements;
  pIVar7 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  local_45c = 0;
  (*pIVar7->_vptr_InstanceInterface[6])(pIVar7,pVVar8,&local_45c,0);
  if ((ulong)local_45c == 0) {
    pRVar16 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar16,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x4c);
    __cxa_throw(pRVar16,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  local_3f8.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::resize
            (&local_3f8,(ulong)local_45c);
  (*pIVar7->_vptr_InstanceInterface[6])
            (pIVar7,pVVar8,&local_45c,
             local_3f8.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_410 = pVVar8;
  local_408 = pIVar7;
  if (local_45c == 0) {
    pRVar16 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar16,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x54);
    __cxa_throw(pRVar16,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
  }
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar17 = 0;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_398._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_398._M_impl.super__Rb_tree_header._M_header;
  local_398._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_398._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398._M_impl.super__Rb_tree_header._M_node_count = 0;
  pQVar9 = (local_400->
           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_438 = this;
  local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_398._M_impl.super__Rb_tree_header._M_header._M_right =
       local_398._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((local_400->
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      )._M_impl.super__Vector_impl_data._M_finish == pQVar9) {
    local_458 = (VkDeviceQueueCreateInfo *)0x0;
    iStack_450._M_current = (VkDeviceQueueCreateInfo *)0x0;
    local_448 = (VkDeviceQueueCreateInfo *)0x0;
  }
  else {
    local_3d0 = &this->m_queues;
    do {
      pQVar9 = pQVar9 + uVar17;
      uVar20 = 0;
      uVar23 = 0;
      local_3d8 = uVar17;
      do {
        uVar17 = ((long)local_3f8.
                        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_3f8.
                        super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar17 < uVar20 || uVar17 - uVar20 == 0) {
LAB_0076cf88:
          this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_03,"No match found for queue requirements",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
                     ,0x65);
          __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        uVar22 = uVar20;
        uVar19 = (uint)uVar20;
        while( true ) {
          uVar18 = uVar19 + 1;
          uVar20 = (ulong)uVar18;
          if ((pQVar9->queueFlags &
              ~local_3f8.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar22].queueFlags) == 0) break;
          uVar22 = uVar20;
          uVar19 = uVar18;
          if (uVar17 < uVar20 || uVar17 - uVar20 == 0) goto LAB_0076cf88;
        }
        local_154.robustBufferAccess = uVar19;
        if (uVar18 == 0) goto LAB_0076cf88;
        dVar25 = pQVar9->queueCount - uVar23;
        if ((int)local_3f8.
                 super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19].queueCount < (int)dVar25) {
          dVar25 = local_3f8.
                   super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19].queueCount;
        }
        local_42c = uVar23;
        pmVar10 = std::
                  map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                  ::operator[](&local_3c8,&local_154.robustBufferAccess);
        dVar24 = pmVar10->queueCount;
        pmVar10 = std::
                  map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                  ::operator[](&local_3c8,&local_154.robustBufferAccess);
        if ((int)dVar24 < (int)dVar25) {
          dVar24 = dVar25;
        }
        pmVar10->queueCount = dVar24;
        if (dVar25 != 0) {
          dVar24 = 0;
          do {
            local_368.memoryTypes[1].propertyFlags = dVar24;
            local_368.memoryTypes[0].heapIndex = uVar19;
            this_01 = (vector<vkt::sparse::Queue,std::allocator<vkt::sparse::Queue>> *)
                      std::
                      map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
                      ::operator[](local_3d0,&pQVar9->queueFlags);
            __position._M_current = *(Queue **)(this_01 + 8);
            if (__position._M_current == *(Queue **)(this_01 + 0x10)) {
              std::vector<vkt::sparse::Queue,std::allocator<vkt::sparse::Queue>>::
              _M_realloc_insert<vkt::sparse::Queue_const&>(this_01,__position,(Queue *)&local_368);
            }
            else {
              (__position._M_current)->queueHandle = (VkQueue)local_368._0_8_;
              (__position._M_current)->queueFamilyIndex = local_368.memoryTypes[0].heapIndex;
              (__position._M_current)->queueIndex = local_368.memoryTypes[1].propertyFlags;
              *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x10;
            }
            dVar24 = dVar24 + 1;
          } while (dVar25 != dVar24);
        }
        uVar23 = local_42c + dVar25;
        local_154.robustBufferAccess = uVar18;
      } while (uVar23 < pQVar9->queueCount);
      uVar17 = (ulong)((int)local_3d8 + 1);
      pQVar9 = (local_400->
               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(local_400->
                                    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar9 >> 3)
            );
    local_458 = (VkDeviceQueueCreateInfo *)0x0;
    iStack_450._M_current = (VkDeviceQueueCreateInfo *)0x0;
    local_448 = (VkDeviceQueueCreateInfo *)0x0;
    if ((_Rb_tree_header *)local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_3c8._M_t._M_impl.super__Rb_tree_header) {
      p_Var12 = local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        __k = p_Var12 + 1;
        if (*(int *)&p_Var12[1].field_0x4 == 0) {
          uVar23 = 0;
        }
        else {
          uVar19 = 0;
          do {
            pmVar11 = std::
                      map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                      ::operator[]((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                    *)&local_398,&__k->_M_color);
            local_368.memoryTypeCount = 0x3f800000;
            __position_00._M_current =
                 (pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (pmVar11,__position_00,(float *)&local_368);
            }
            else {
              *__position_00._M_current = 1.0;
              (pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
            uVar19 = uVar19 + 1;
            uVar23 = *(uint *)&p_Var12[1].field_0x4;
          } while (uVar19 < uVar23);
        }
        local_368.memoryTypeCount = 2;
        local_368.memoryTypes._4_8_ = (void *)0x0;
        local_368.memoryTypes._12_8_ = (ulong)__k->_M_color << 0x20;
        local_368.memoryTypes[2].heapIndex = uVar23;
        pmVar11 = std::
                  map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&local_398,&__k->_M_color);
        local_368.memoryTypes._28_8_ =
             (pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
        if (iStack_450._M_current == local_448) {
          std::vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>::
          _M_realloc_insert<vk::VkDeviceQueueCreateInfo_const&>
                    ((vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>
                      *)&local_458,iStack_450,(VkDeviceQueueCreateInfo *)&local_368);
        }
        else {
          (iStack_450._M_current)->pQueuePriorities = (float *)local_368.memoryTypes._28_8_;
          (iStack_450._M_current)->flags = local_368.memoryTypes[1].heapIndex;
          (iStack_450._M_current)->queueFamilyIndex = local_368.memoryTypes[2].propertyFlags;
          *(ulong *)&(iStack_450._M_current)->queueCount =
               CONCAT44(local_368.memoryTypes[3].propertyFlags,local_368.memoryTypes[2].heapIndex);
          (iStack_450._M_current)->sType = local_368.memoryTypeCount;
          *(VkMemoryPropertyFlags *)&(iStack_450._M_current)->field_0x4 =
               local_368.memoryTypes[0].propertyFlags;
          (iStack_450._M_current)->pNext = (void *)local_368.memoryTypes._4_8_;
          iStack_450._M_current = iStack_450._M_current + 1;
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != &local_3c8._M_t._M_impl.super__Rb_tree_header);
    }
  }
  pIVar7 = local_408;
  pVVar8 = local_410;
  ::vk::getPhysicalDeviceFeatures(&local_154,local_408,local_410);
  local_78.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_78.pNext = (void *)0x0;
  local_78.flags = 0;
  local_78.queueCreateInfoCount =
       (int)((ulong)((long)iStack_450._M_current - (long)local_458) >> 3) * -0x33333333;
  local_78.pQueueCreateInfos = local_458;
  local_78.enabledLayerCount = 0;
  local_78.ppEnabledLayerNames = (char **)0x0;
  local_78.enabledExtensionCount = 0;
  local_78.ppEnabledExtensionNames = (char **)0x0;
  local_78.pEnabledFeatures = &local_154;
  ::vk::createDevice(&local_428,pIVar7,pVVar8,&local_78,(VkAllocationCallbacks *)0x0);
  pVVar6 = local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  p_Var5 = local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  pVVar4 = local_428.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  pSVar21 = local_438;
  local_368.memoryTypes._12_8_ =
       local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  local_368._0_8_ = local_428.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_368.memoryTypes._4_8_ =
       local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_428.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice)0x0;
  local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar1 = &local_438->m_logicalDevice;
  pVVar2 = (local_438->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  if (pVVar2 == (VkDevice)0x0) {
    (local_438->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = pVVar6
    ;
    (pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object = pVVar4;
    (local_438->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
         p_Var5;
  }
  else {
    (*(local_438->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (pVVar2,(local_438->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.
                      m_allocator);
    (pSVar21->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_368.memoryTypes._12_8_;
    (pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object = (VkDevice_s *)local_368._0_8_;
    (pSVar21->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
         (DestroyDeviceFunc)local_368.memoryTypes._4_8_;
    if (local_428.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
      (*local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                (local_428.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 local_428.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
    }
  }
  pDVar13 = (DeviceDriver *)operator_new(0x4b8);
  ::vk::DeviceDriver::DeviceDriver
            (pDVar13,pIVar7,(pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object);
  local_368.memoryTypeCount = 0;
  local_368.memoryTypes[0].propertyFlags = 0;
  this_00 = &pSVar21->m_deviceDriver;
  if ((pSVar21->m_deviceDriver).
      super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr !=
      pDVar13) {
    de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
              (&this_00->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>);
    (this_00->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>).m_data.ptr
         = pDVar13;
  }
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
            ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)&local_368);
  this_02 = (SimpleAllocator *)operator_new(0x220);
  pDVar13 = (this_00->super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>).
            m_data.ptr;
  pVVar2 = (pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object;
  ::vk::getPhysicalDeviceMemoryProperties(&local_368,local_408,local_410);
  ::vk::SimpleAllocator::SimpleAllocator(this_02,&pDVar13->super_DeviceInterface,pVVar2,&local_368);
  pSVar3 = (SimpleAllocator *)
           (pSVar21->m_allocator).
           super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  if (pSVar3 != this_02) {
    if (pSVar3 != (SimpleAllocator *)0x0) {
      (*(pSVar3->super_Allocator)._vptr_Allocator[1])();
    }
    (pSVar21->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.
    m_data.ptr = (Allocator *)this_02;
  }
  pSVar15 = (SparseResourcesBaseInstance *)
            (pSVar21->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pSVar21 = (SparseResourcesBaseInstance *)&(pSVar21->m_queues)._M_t._M_impl.super__Rb_tree_header;
  if (pSVar15 != pSVar21) {
    do {
      local_438 = pSVar21;
      p_Var12 = (pSVar15->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((pSVar15->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right != p_Var12) {
        uVar23 = 1;
        uVar17 = 0;
        do {
          pDVar13 = (DeviceDriver *)(pMVar1->super_RefBase<vk::VkDevice_s_*>).m_data.object;
          pVVar14 = ::vk::getDeviceQueue
                              (&((this_00->
                                 super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                                 ).m_data.ptr)->super_DeviceInterface,(VkDevice)pDVar13,
                               *(deUint32 *)(&p_Var12->_M_parent + uVar17 * 2),
                               *(deUint32 *)((long)&p_Var12->_M_parent + uVar17 * 0x10 + 4));
          *(VkQueue *)(&p_Var12->_M_color + uVar17 * 4) = pVVar14;
          uVar17 = (ulong)uVar23;
          p_Var12 = (pSVar15->m_queues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          uVar23 = uVar23 + 1;
        } while (uVar17 < (ulong)((long)(pSVar15->m_queues)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_right - (long)p_Var12 >> 4));
      }
      pSVar15 = (SparseResourcesBaseInstance *)
                std::_Rb_tree_increment((_Rb_tree_node_base *)pSVar15);
      pSVar21 = local_438;
    } while (pSVar15 != local_438);
  }
  if (local_458 != (VkDeviceQueueCreateInfo *)0x0) {
    pDVar13 = (DeviceDriver *)((long)local_448 - (long)local_458);
    operator_delete(local_458,(ulong)pDVar13);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&local_398);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>,_std::_Select1st<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
  ::_M_erase((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>,_std::_Select1st<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
              *)local_3c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)pDVar13
            );
  if (local_3f8.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f8.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f8.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SparseResourcesBaseInstance::createDeviceSupportingQueues(const QueueRequirementsVec& queueRequirements)
{
	typedef std::map<vk::VkQueueFlags, std::vector<Queue> >		QueuesMap;
	typedef std::map<deUint32, QueueFamilyQueuesCount>			SelectedQueuesMap;
	typedef std::map<deUint32, std::vector<float> >				QueuePrioritiesMap;

	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	deUint32 queueFamilyPropertiesCount = 0u;
	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, DE_NULL);

	if(queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	std::vector<VkQueueFamilyProperties> queueFamilyProperties;
	queueFamilyProperties.resize(queueFamilyPropertiesCount);

	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, &queueFamilyProperties[0]);

	if (queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	SelectedQueuesMap	selectedQueueFamilies;
	QueuePrioritiesMap	queuePriorities;

	for (deUint32 queueReqNdx = 0; queueReqNdx < queueRequirements.size(); ++queueReqNdx)
	{
		const QueueRequirements& queueRequirement = queueRequirements[queueReqNdx];

		deUint32 queueFamilyIndex	= 0u;
		deUint32 queuesFoundCount	= 0u;

		do
		{
			queueFamilyIndex = findMatchingQueueFamilyIndex(queueFamilyProperties, queueRequirement.queueFlags, queueFamilyIndex);

			if (queueFamilyIndex == NO_MATCH_FOUND)
				TCU_THROW(NotSupportedError, "No match found for queue requirements");

			const deUint32 queuesPerFamilyCount = deMin32(queueFamilyProperties[queueFamilyIndex].queueCount, queueRequirement.queueCount - queuesFoundCount);

			selectedQueueFamilies[queueFamilyIndex].queueCount = deMax32(queuesPerFamilyCount, selectedQueueFamilies[queueFamilyIndex].queueCount);

			for (deUint32 queueNdx = 0; queueNdx < queuesPerFamilyCount; ++queueNdx)
			{
				Queue queue;
				queue.queueFamilyIndex	= queueFamilyIndex;
				queue.queueIndex		= queueNdx;

				m_queues[queueRequirement.queueFlags].push_back(queue);
			}

			queuesFoundCount += queuesPerFamilyCount;

			++queueFamilyIndex;
		} while (queuesFoundCount < queueRequirement.queueCount);
	}

	std::vector<VkDeviceQueueCreateInfo> queueInfos;

	for (SelectedQueuesMap::iterator queueFamilyIter = selectedQueueFamilies.begin(); queueFamilyIter != selectedQueueFamilies.end(); ++queueFamilyIter)
	{
		for (deUint32 queueNdx = 0; queueNdx < queueFamilyIter->second.queueCount; ++queueNdx)
			queuePriorities[queueFamilyIter->first].push_back(1.0f);

		const VkDeviceQueueCreateInfo queueInfo =
		{
			VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,		// VkStructureType             sType;
			DE_NULL,										// const void*                 pNext;
			(VkDeviceQueueCreateFlags)0u,					// VkDeviceQueueCreateFlags    flags;
			queueFamilyIter->first,							// uint32_t                    queueFamilyIndex;
			queueFamilyIter->second.queueCount,				// uint32_t                    queueCount;
			&queuePriorities[queueFamilyIter->first][0],	// const float*                pQueuePriorities;
		};

		queueInfos.push_back(queueInfo);
	}

	const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(instance, physicalDevice);
	const VkDeviceCreateInfo		deviceInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,		// VkStructureType                    sType;
		DE_NULL,									// const void*                        pNext;
		(VkDeviceCreateFlags)0,						// VkDeviceCreateFlags                flags;
		static_cast<deUint32>(queueInfos.size()),	// uint32_t                           queueCreateInfoCount;
		&queueInfos[0],								// const VkDeviceQueueCreateInfo*     pQueueCreateInfos;
		0u,											// uint32_t                           enabledLayerCount;
		DE_NULL,									// const char* const*                 ppEnabledLayerNames;
		0u,											// uint32_t                           enabledExtensionCount;
		DE_NULL,									// const char* const*                 ppEnabledExtensionNames;
		&deviceFeatures,							// const VkPhysicalDeviceFeatures*    pEnabledFeatures;
	};

	m_logicalDevice = createDevice(instance, physicalDevice, &deviceInfo);
	m_deviceDriver	= de::MovePtr<DeviceDriver>(new DeviceDriver(instance, *m_logicalDevice));
	m_allocator		= de::MovePtr<Allocator>(new SimpleAllocator(*m_deviceDriver, *m_logicalDevice, getPhysicalDeviceMemoryProperties(instance, physicalDevice)));

	for (QueuesMap::iterator queuesIter = m_queues.begin(); queuesIter != m_queues.end(); ++queuesIter)
	{
		for (deUint32 queueNdx = 0u; queueNdx < queuesIter->second.size(); ++queueNdx)
		{
			Queue& queue = queuesIter->second[queueNdx];

			queue.queueHandle = getDeviceQueue(*m_deviceDriver, *m_logicalDevice, queue.queueFamilyIndex, queue.queueIndex);
		}
	}
}